

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_> *this,TPZCompMesh *mesh,
          TPZGeoEl *gel)

{
  *(undefined ***)
   &(this->super_TPZCompElH1<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZSavable_01955610;
  TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
            (&this->super_TPZCompElH1<pzshape::TPZShapeQuad>,&PTR_PTR_019542c8,mesh,gel,EH1Standard)
  ;
  *(undefined ***)
   &(this->super_TPZCompElH1<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElWithMem_01953ef8;
  TPZVec<long>::TPZVec((TPZVec<long> *)&this->fIntPtIndices,0);
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore =
       (this->fIntPtIndices).super_TPZManVector<long,_128>.fExtAlloc;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNAlloc = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01962610;
  (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapeQuad>).
                         super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x168))(this);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh, TPZGeoEl *gel) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh, gel){
    PrepareIntPtIndices();
}